

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

void convert_stringmap(context *ctx,table *tbl)

{
  lua_State *L_00;
  int iVar1;
  undefined4 *puVar2;
  lua_Integer lVar3;
  int idx;
  state *s;
  lua_State *L;
  table *tbl_local;
  context *ctx_local;
  
  L_00 = ctx->L;
  lua_checkstack(L_00,ctx->string_index + 0x14);
  lua_settop(L_00,ctx->string_index + 1);
  lua_pushvalue(L_00,1);
  puVar2 = (undefined4 *)lua_newuserdata(L_00,0x10);
  *puVar2 = 0;
  puVar2[1] = 0;
  *(table **)(puVar2 + 2) = tbl;
  lua_copy(L_00,-1,1);
  lua_settop(L_00,-2);
  lua_copy(L_00,-1,-2);
  lua_settop(L_00,-2);
  lua_pushnil(L_00);
  while( true ) {
    iVar1 = lua_next(L_00,-2);
    if (iVar1 == 0) break;
    lVar3 = lua_tointegerx(L_00,-1,(int *)0x0);
    lua_settop(L_00,-2);
    lua_pushvalue(L_00,-1);
    lua_copy(L_00,-1,(int)lVar3);
    lua_settop(L_00,-2);
  }
  lua_settop(L_00,-2);
  lua_gc(L_00,2,0);
  return;
}

Assistant:

static void
convert_stringmap(struct context *ctx, struct table *tbl) {
	lua_State *L = ctx->L;
	lua_checkstack(L, ctx->string_index + LUA_MINSTACK);
	lua_settop(L, ctx->string_index + 1);
	lua_pushvalue(L, 1);
	struct state * s = lua_newuserdata(L, sizeof(*s));
	s->dirty = 0;
	s->ref = 0;
	s->root = tbl;
	lua_replace(L, 1);
	lua_replace(L, -2);

	lua_pushnil(L);
	// ... stringmap nil
	while (lua_next(L, -2) != 0) {
		int idx = lua_tointeger(L, -1);
		lua_pop(L, 1);
		lua_pushvalue(L, -1);
		lua_replace(L, idx);
	}

	lua_pop(L, 1);

	lua_gc(L, LUA_GCCOLLECT, 0);
}